

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDFace *quad_face,double quad_s,double quad_t)

{
  bool bVar1;
  ON_2dPoint OVar2;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_58;
  ON_2dPoint p;
  ON_SubDFaceParameter fp;
  double quad_t_local;
  double quad_s_local;
  ON_SubDFace *quad_face_local;
  ON_SubDComponentParameter *this_local;
  
  this->m_cid = ON_SubDComponentId::Unset;
  memset(&this->m_p0,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p0).v_active_e);
  memset(&this->m_p1,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p1).v_active_f);
  if ((quad_face != (ON_SubDFace *)0x0) && (quad_face->m_edge_count == 4)) {
    ON_SubDComponentId::ON_SubDComponentId((ON_SubDComponentId *)&fp.m_t,quad_face);
    bVar1 = Internal_Init(this,(ON_SubDComponentId)fp.m_t);
    if (bVar1) {
      ON_SubDFaceParameter::CreateFromQuadFaceParameteters
                ((ON_SubDFaceParameter *)&p.y,quad_s,quad_t);
      OVar2 = ON_SubDFaceParameter::FaceCornerParameters((ON_SubDFaceParameter *)&p.y);
      local_58 = (anon_union_8_3_6bf0bb0e_for_m_p0)OVar2.x;
      this->m_p0 = local_58;
      p.x = OVar2.y;
      (this->m_p1).f_corner_t = p.x;
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const class ON_SubDFace* quad_face,
  double quad_s,
  double quad_t
)
{
  if (
    nullptr != quad_face
    && 4 == quad_face->m_edge_count
    && Internal_Init(quad_face)
    )
  {
    const ON_SubDFaceParameter fp = ON_SubDFaceParameter::CreateFromQuadFaceParameteters(quad_s, quad_t);
    const ON_2dPoint p = fp.FaceCornerParameters();
    this->m_p0.f_corner_s = p.x;
    this->m_p1.f_corner_t = p.y;
  }
}